

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

DateFmtBestPattern * __thiscall
icu_63::DateFmtBestPatternKey::createObject
          (DateFmtBestPatternKey *this,void *param_1,UErrorCode *status)

{
  UBool UVar1;
  DateTimePatternGenerator *pDVar2;
  DateFmtBestPattern *this_00;
  DateFmtBestPattern *local_b8;
  DateFmtBestPattern *result;
  UnicodeString local_90;
  undefined1 local_49;
  DateFmtBestPattern *local_48;
  LocalPointerBase<icu_63::DateFmtBestPattern> local_40;
  LocalPointer<icu_63::DateFmtBestPattern> pattern;
  LocalPointerBase<icu_63::DateTimePatternGenerator> local_30;
  LocalPointer<icu_63::DateTimePatternGenerator> dtpg;
  UErrorCode *status_local;
  void *param_1_local;
  DateFmtBestPatternKey *this_local;
  
  dtpg.super_LocalPointerBase<icu_63::DateTimePatternGenerator>.ptr =
       (LocalPointerBase<icu_63::DateTimePatternGenerator>)
       (LocalPointerBase<icu_63::DateTimePatternGenerator>)status;
  pDVar2 = DateTimePatternGenerator::createInstance
                     (&(this->super_LocaleCacheKey<icu_63::DateFmtBestPattern>).fLoc,status);
  LocalPointer<icu_63::DateTimePatternGenerator>::LocalPointer
            ((LocalPointer<icu_63::DateTimePatternGenerator> *)&local_30,pDVar2);
  UVar1 = ::U_FAILURE(*(UErrorCode *)
                       dtpg.super_LocalPointerBase<icu_63::DateTimePatternGenerator>.ptr);
  if (UVar1 == '\0') {
    this_00 = (DateFmtBestPattern *)UMemory::operator_new((UMemory *)0x58,(size_t)pDVar2);
    local_b8 = (DateFmtBestPattern *)0x0;
    if (this_00 != (DateFmtBestPattern *)0x0) {
      local_49 = 1;
      local_48 = this_00;
      pDVar2 = LocalPointerBase<icu_63::DateTimePatternGenerator>::operator->(&local_30);
      DateTimePatternGenerator::getBestPattern
                (&local_90,pDVar2,&this->fSkeleton,
                 (UErrorCode *)dtpg.super_LocalPointerBase<icu_63::DateTimePatternGenerator>.ptr);
      DateFmtBestPattern::DateFmtBestPattern(this_00,&local_90);
      local_b8 = this_00;
    }
    local_49 = 0;
    LocalPointer<icu_63::DateFmtBestPattern>::LocalPointer
              ((LocalPointer<icu_63::DateFmtBestPattern> *)&local_40,local_b8,
               (UErrorCode *)dtpg.super_LocalPointerBase<icu_63::DateTimePatternGenerator>.ptr);
    if (this_00 != (DateFmtBestPattern *)0x0) {
      icu_63::UnicodeString::~UnicodeString(&local_90);
    }
    UVar1 = ::U_FAILURE(*(UErrorCode *)
                         dtpg.super_LocalPointerBase<icu_63::DateTimePatternGenerator>.ptr);
    if (UVar1 == '\0') {
      this_local = (DateFmtBestPatternKey *)
                   LocalPointerBase<icu_63::DateFmtBestPattern>::orphan(&local_40);
      SharedObject::addRef((SharedObject *)this_local);
    }
    else {
      this_local = (DateFmtBestPatternKey *)0x0;
    }
    pattern.super_LocalPointerBase<icu_63::DateFmtBestPattern>.ptr._4_4_ = 1;
    LocalPointer<icu_63::DateFmtBestPattern>::~LocalPointer
              ((LocalPointer<icu_63::DateFmtBestPattern> *)&local_40);
  }
  else {
    this_local = (DateFmtBestPatternKey *)0x0;
    pattern.super_LocalPointerBase<icu_63::DateFmtBestPattern>.ptr._4_4_ = 1;
  }
  LocalPointer<icu_63::DateTimePatternGenerator>::~LocalPointer
            ((LocalPointer<icu_63::DateTimePatternGenerator> *)&local_30);
  return (DateFmtBestPattern *)this_local;
}

Assistant:

virtual const DateFmtBestPattern *createObject(
            const void * /*unused*/, UErrorCode &status) const {
        LocalPointer<DateTimePatternGenerator> dtpg(
                    DateTimePatternGenerator::createInstance(fLoc, status));
        if (U_FAILURE(status)) {
            return NULL;
        }
  
        LocalPointer<DateFmtBestPattern> pattern(
                new DateFmtBestPattern(
                        dtpg->getBestPattern(fSkeleton, status)),
                status);
        if (U_FAILURE(status)) {
            return NULL;
        }
        DateFmtBestPattern *result = pattern.orphan();
        result->addRef();
        return result;
    }